

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O2

void __thiscall
ncnn::cubic_coeffs(ncnn *this,int w,int outw,int *xofs,float *alpha,int align_corner)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 in_register_00000014;
  int iVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  float *pfVar10;
  float *pfVar11;
  undefined8 in_XMM0_Qa;
  double dVar12;
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar13 [16];
  
  iVar8 = (int)this;
  if ((int)alpha == 0) {
    dVar12 = (double)iVar8 / (double)w;
  }
  else {
    dVar12 = (double)(iVar8 + -1) / (double)(w + -1);
  }
  auVar13._8_8_ = in_XMM0_Qa;
  auVar13._0_8_ = dVar12;
  uVar9 = 0;
  uVar7 = (ulong)(uint)w;
  if (w < 1) {
    uVar7 = uVar9;
  }
  pfVar10 = (float *)(xofs + 3);
  auVar14._8_4_ = 0x3f800000;
  auVar14._0_8_ = 0x3f8000003f800000;
  auVar14._12_4_ = 0x3f800000;
  do {
    if (uVar7 == uVar9) {
      return;
    }
    auVar16._8_8_ = 0;
    auVar16._0_8_ = (double)(int)uVar9 + 0.5;
    auVar17 = vfmadd213sd_fma(auVar16,auVar13,ZEXT816(0xbfe0000000000000));
    if ((int)alpha != 0) {
      auVar17._8_8_ = 0;
      auVar17._0_8_ = (double)(int)uVar9 * dVar12;
    }
    auVar18._0_4_ = (float)auVar17._0_8_;
    auVar18._4_12_ = auVar17._4_12_;
    auVar17 = vroundss_avx(auVar18,auVar18,9);
    iVar6 = (int)auVar17._0_4_;
    fVar15 = auVar18._0_4_ - auVar17._0_4_;
    fVar5 = 1.0 - fVar15;
    auVar17 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0c00000),0),ZEXT416((uint)(fVar15 + 1.0)),
                              SUB6416(ZEXT464(0x40400000),0));
    auVar17 = vblendps_avx(auVar17,auVar14,0xe);
    auVar16 = vinsertps_avx(ZEXT416((uint)(fVar15 + 1.0)),ZEXT416((uint)fVar15),0x10);
    fVar15 = auVar16._0_4_;
    auVar21._0_4_ = fVar15 * fVar15;
    fVar2 = auVar16._4_4_;
    auVar21._4_4_ = fVar2 * fVar2;
    fVar3 = auVar16._8_4_;
    auVar21._8_4_ = fVar3 * fVar3;
    fVar4 = auVar16._12_4_;
    auVar21._12_4_ = fVar4 * fVar4;
    auVar19._0_4_ = fVar15 * 0.75;
    auVar19._4_4_ = fVar2 * 1.25;
    auVar19._8_4_ = fVar3 * 0.0;
    auVar19._12_4_ = fVar4 * 0.0;
    auVar16 = vsubps_avx(SUB6416(ZEXT464(0x40700000),0),auVar19);
    auVar20._0_4_ = auVar19._0_4_ + -2.25;
    auVar20._4_4_ = auVar19._4_4_ + -2.25;
    auVar20._8_4_ = auVar19._8_4_ + -2.25;
    auVar20._12_4_ = auVar19._12_4_ + -2.25;
    auVar16 = vblendps_avx(auVar16,auVar20,2);
    auVar17 = vfmadd213ps_fma(auVar16,auVar21,auVar17);
    fVar15 = auVar17._0_4_;
    uVar1 = vmovlps_avx(auVar17);
    *(undefined8 *)(pfVar10 + -3) = uVar1;
    auVar16 = vfmadd213ss_fma(ZEXT416((uint)fVar5),SUB6416(ZEXT464(0x3fa00000),0),
                              SUB6416(ZEXT464(0xc0100000),0));
    fVar2 = auVar16._0_4_ * fVar5 * fVar5;
    pfVar10[-1] = fVar2 + 1.0;
    auVar17 = vmovshdup_avx(auVar17);
    *pfVar10 = -(fVar15 + fVar2 + auVar17._0_4_);
    if (iVar6 < 0) {
      pfVar11 = (float *)(xofs + uVar9 * 4 + 3);
      fVar15 = 1.0 - *pfVar10;
      pfVar10[-3] = fVar15;
      pfVar10[-2] = *pfVar10;
      pfVar10[-1] = 0.0;
LAB_003cae19:
      *pfVar11 = 0.0;
      iVar6 = 1;
    }
    else if (iVar6 == 0) {
      fVar15 = fVar15 + pfVar10[-2];
      pfVar10[-3] = fVar15;
      *(undefined8 *)(pfVar10 + -2) = *(undefined8 *)(pfVar10 + -1);
      pfVar11 = pfVar10;
      goto LAB_003cae19;
    }
    if (iVar6 == iVar8 + -2) {
      *pfVar10 = *pfVar10 + pfVar10[-1];
      pfVar10[-1] = pfVar10[-2];
      pfVar10[-2] = fVar15;
LAB_003cae61:
      pfVar10[-3] = 0.0;
      iVar6 = iVar8 + -3;
    }
    else if (iVar8 + -1 <= iVar6) {
      *pfVar10 = 1.0 - fVar15;
      pfVar10[-1] = fVar15;
      pfVar10[-2] = 0.0;
      goto LAB_003cae61;
    }
    *(int *)(CONCAT44(in_register_00000014,outw) + uVar9 * 4) = iVar6;
    uVar9 = uVar9 + 1;
    pfVar10 = pfVar10 + 4;
  } while( true );
}

Assistant:

static void cubic_coeffs(int w, int outw, int* xofs, float* alpha, int align_corner)
{
    double scale = (double)w / outw;
    if (align_corner)
    {
        scale = (double)(w - 1) / (outw - 1);
    }

    for (int dx = 0; dx < outw; dx++)
    {
        float fx = (float)((dx + 0.5) * scale - 0.5);
        if (align_corner)
        {
            fx = static_cast<float>(dx * scale);
        }

        int sx = static_cast<int>(floor(fx));
        fx -= sx;

        interpolate_cubic(fx, alpha + dx * 4);

        if (sx <= -1)
        {
            sx = 1;
            alpha[dx * 4 + 0] = 1.f - alpha[dx * 4 + 3];
            alpha[dx * 4 + 1] = alpha[dx * 4 + 3];
            alpha[dx * 4 + 2] = 0.f;
            alpha[dx * 4 + 3] = 0.f;
        }
        if (sx == 0)
        {
            sx = 1;
            alpha[dx * 4 + 0] = alpha[dx * 4 + 0] + alpha[dx * 4 + 1];
            alpha[dx * 4 + 1] = alpha[dx * 4 + 2];
            alpha[dx * 4 + 2] = alpha[dx * 4 + 3];
            alpha[dx * 4 + 3] = 0.f;
        }
        if (sx == w - 2)
        {
            sx = w - 3;
            alpha[dx * 4 + 3] = alpha[dx * 4 + 2] + alpha[dx * 4 + 3];
            alpha[dx * 4 + 2] = alpha[dx * 4 + 1];
            alpha[dx * 4 + 1] = alpha[dx * 4 + 0];
            alpha[dx * 4 + 0] = 0.f;
        }
        if (sx >= w - 1)
        {
            sx = w - 3;
            alpha[dx * 4 + 3] = 1.f - alpha[dx * 4 + 0];
            alpha[dx * 4 + 2] = alpha[dx * 4 + 0];
            alpha[dx * 4 + 1] = 0.f;
            alpha[dx * 4 + 0] = 0.f;
        }

        xofs[dx] = sx;
    }
}